

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O3

int run_test_threadpool_cancel_single(void)

{
  int iVar1;
  undefined8 uVar2;
  long *plVar3;
  long lVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_work_t req;
  long lStack_170;
  undefined1 auStack_168 [32];
  undefined1 *apuStack_148 [16];
  code *pcStack_c8;
  undefined8 uStack_b8;
  code *pcStack_b0;
  ulong local_a8;
  ulong local_a0;
  undefined1 local_98 [128];
  
  pcStack_b0 = (code *)0x1d4fb2;
  saturate_threadpool();
  pcStack_b0 = (code *)0x1d4fb7;
  uVar2 = uv_default_loop();
  pcStack_b0 = (code *)0x1d4fd5;
  iVar1 = uv_queue_work(uVar2,local_98,abort,nop_done_cb);
  local_a0 = (ulong)iVar1;
  local_a8 = 0;
  if (local_a0 == 0) {
    pcStack_b0 = (code *)0x1d4ffd;
    iVar1 = uv_cancel(local_98);
    local_a0 = (ulong)iVar1;
    local_a8 = 0;
    if (local_a0 != 0) goto LAB_001d5105;
    local_a0 = (ulong)done_cb_called;
    local_a8 = 0;
    if (local_a0 != 0) goto LAB_001d5112;
    lVar4 = 0;
    local_a0 = 0;
    do {
      pcStack_b0 = (code *)0x1d5050;
      uv_sem_post((long)pause_sems + lVar4);
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0x80);
    pcStack_b0 = (code *)0x1d5067;
    iVar1 = uv_run(uVar2,0);
    local_a0 = (ulong)iVar1;
    local_a8 = 0;
    if (local_a0 != 0) goto LAB_001d511f;
    local_a0 = 1;
    local_a8 = (ulong)done_cb_called;
    if (local_a8 != 1) goto LAB_001d512c;
    pcStack_b0 = (code *)0x1d50b8;
    uv_walk(uVar2,close_walk_cb,0);
    pcStack_b0 = (code *)0x1d50c2;
    uv_run(uVar2,0);
    local_a0 = 0;
    pcStack_b0 = (code *)0x1d50d3;
    iVar1 = uv_loop_close(uVar2);
    local_a8 = (ulong)iVar1;
    if (local_a0 == local_a8) {
      pcStack_b0 = (code *)0x1d50e9;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_b0 = (code *)0x1d5105;
    run_test_threadpool_cancel_single_cold_1();
LAB_001d5105:
    pcStack_b0 = (code *)0x1d5112;
    run_test_threadpool_cancel_single_cold_2();
LAB_001d5112:
    pcStack_b0 = (code *)0x1d511f;
    run_test_threadpool_cancel_single_cold_3();
LAB_001d511f:
    pcStack_b0 = (code *)0x1d512c;
    run_test_threadpool_cancel_single_cold_4();
LAB_001d512c:
    pcStack_b0 = (code *)0x1d5139;
    run_test_threadpool_cancel_single_cold_5();
  }
  iVar1 = (int)&local_a8;
  pcStack_b0 = nop_done_cb;
  run_test_threadpool_cancel_single_cold_6();
  pcStack_b0 = (code *)(long)iVar1;
  uStack_b8 = 0xffffffffffffff83;
  if (pcStack_b0 == (code *)0xffffffffffffff83) {
    done_cb_called = done_cb_called + 1;
    return iVar1;
  }
  pcStack_c8 = run_test_threadpool_cancel_when_busy;
  nop_done_cb_cold_1();
  apuStack_148[0] = auStack_168;
  pcStack_c8 = (code *)uVar2;
  iVar1 = uv_sem_init(apuStack_148[0],0);
  lStack_170 = (long)iVar1;
  if (lStack_170 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_queue_work(uVar2,apuStack_148,busy_cb,after_busy_cb);
    lStack_170 = (long)iVar1;
    if (lStack_170 != 0) goto LAB_001d52e8;
    uv_sem_wait(auStack_168);
    iVar1 = uv_cancel(apuStack_148);
    lStack_170 = (long)iVar1;
    if (lStack_170 != -0x10) goto LAB_001d52f5;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    lStack_170 = (long)iVar1;
    if (lStack_170 != 0) goto LAB_001d5302;
    lStack_170 = 1;
    if (done_cb_called == 1) {
      uv_sem_destroy(auStack_168);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      lStack_170 = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (lStack_170 == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d531c;
    }
  }
  else {
    run_test_threadpool_cancel_when_busy_cold_1();
LAB_001d52e8:
    run_test_threadpool_cancel_when_busy_cold_2();
LAB_001d52f5:
    run_test_threadpool_cancel_when_busy_cold_3();
LAB_001d5302:
    run_test_threadpool_cancel_when_busy_cold_4();
  }
  run_test_threadpool_cancel_when_busy_cold_5();
LAB_001d531c:
  plVar3 = &lStack_170;
  run_test_threadpool_cancel_when_busy_cold_6();
  uv_sem_post(*plVar3);
  iVar1 = uv_sleep(10);
  return iVar1;
}

Assistant:

TEST_IMPL(threadpool_cancel_single) {
  uv_loop_t* loop;
  uv_work_t req;

  saturate_threadpool();
  loop = uv_default_loop();
  ASSERT_OK(uv_queue_work(loop, &req, (uv_work_cb) abort, nop_done_cb));
  ASSERT_OK(uv_cancel((uv_req_t*) &req));
  ASSERT_OK(done_cb_called);
  unblock_threadpool();
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, done_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}